

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeFloatingState.cpp
# Opt level: O3

void __thiscall iDynTree::FreeFloatingVel::FreeFloatingVel(FreeFloatingVel *this)

{
  Twist *pTVar1;
  uint i;
  ulong uVar2;
  Twist *this_00;
  
  this->_vptr_FreeFloatingVel = (_func_int **)&PTR__FreeFloatingVel_00185100;
  this_00 = &this->m_baseVel;
  iDynTree::Twist::Twist(this_00);
  uVar2 = 0;
  JointDOFsDoubleArray::JointDOFsDoubleArray(&this->m_jointVel,0);
  do {
    pTVar1 = (Twist *)(&this->field_0x20 + (ulong)((int)uVar2 - 3) * 8);
    if (uVar2 < 3) {
      pTVar1 = this_00;
    }
    *(undefined8 *)pTVar1 = 0;
    uVar2 = uVar2 + 1;
    this_00 = this_00 + 8;
  } while (uVar2 != 6);
  JointDOFsDoubleArray::resize(&this->m_jointVel,0);
  iDynTree::VectorDynSize::zero();
  return;
}

Assistant:

FreeFloatingVel::FreeFloatingVel()
{
    this->m_baseVel.zero();
    this->m_jointVel.resize(0);
    this->m_jointVel.zero();
}